

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O0

int __thiscall xercesc_4_0::ContentSpecNode::getMinTotalRange(ContentSpecNode *this)

{
  int iVar1;
  int iVar2;
  int minSecond;
  int minFirst;
  int min;
  ContentSpecNode *this_local;
  
  minSecond = this->fMinOccurs;
  if ((((this->fType & (Any_NS|Any_Other)) == Sequence) || (this->fType == All)) ||
     ((this->fType & (Any_NS|Any_Other)) == Choice)) {
    iVar1 = getMinTotalRange(this->fFirst);
    iVar2 = iVar1;
    if (this->fSecond != (ContentSpecNode *)0x0) {
      iVar2 = getMinTotalRange(this->fSecond);
      if ((this->fType & (Any_NS|Any_Other)) == Choice) {
        if (iVar1 < iVar2) {
          iVar2 = iVar1;
        }
      }
      else {
        iVar2 = iVar1 + iVar2;
      }
    }
    minSecond = minSecond * iVar2;
  }
  return minSecond;
}

Assistant:

int ContentSpecNode::getMinTotalRange() const {

    int min = fMinOccurs;

    if ((fType & 0x0f) == ContentSpecNode::Sequence
        || fType == ContentSpecNode::All
        || (fType & 0x0f) == ContentSpecNode::Choice) {

        int minFirst = fFirst->getMinTotalRange();

        if (fSecond) {

            int minSecond = fSecond->getMinTotalRange();

            if ((fType & 0x0f) == ContentSpecNode::Choice) {
                min = min * ((minFirst < minSecond)? minFirst : minSecond);
            }
            else {
                min = min * (minFirst + minSecond);
            }
        }
        else
            min = min * minFirst;
    }

    return min;
}